

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-https-connect.c
# Opt level: O2

CURLcode baller_connected(Curl_cfilter *cf,Curl_easy *data,cf_hc_baller *winner)

{
  undefined4 *puVar1;
  curl_trc_feat *pcVar2;
  char *pcVar3;
  Curl_cfilter *pCVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  undefined8 uVar7;
  undefined4 uVar8;
  uint uVar9;
  ulong uVar10;
  curltime cVar11;
  curltime newer;
  curltime newer_00;
  curltime older;
  curltime older_00;
  
  puVar1 = (undefined4 *)cf->ctx;
  if ((cf_hc_baller *)(puVar1 + 10) != winner) {
    cf_hc_baller_reset((cf_hc_baller *)(puVar1 + 10),data);
  }
  if ((cf_hc_baller *)(puVar1 + 0x16) != winner) {
    cf_hc_baller_reset((cf_hc_baller *)(puVar1 + 0x16),data);
  }
  uVar9 = cf_hc_baller_reply_ms(winner,data);
  if ((int)uVar9 < 0) {
    if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
        ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level))))
       && (0 < cf->cft->log_level)) {
      pcVar3 = winner->name;
      cVar11 = Curl_now();
      uVar7 = (winner->started).tv_sec;
      uVar8 = (winner->started).tv_usec;
      older_00.tv_usec = uVar8;
      older_00.tv_sec = uVar7;
      newer_00._12_4_ = 0;
      newer_00.tv_sec = SUB128(cVar11._0_12_,0);
      newer_00.tv_usec = SUB124(cVar11._0_12_,8);
      older_00._12_4_ = 0;
      uVar10 = Curl_timediff(newer_00,older_00);
      Curl_trc_cf_infof(data,cf,"deferred handshake %s: %dms",pcVar3,uVar10 & 0xffffffff);
    }
  }
  else if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
          (((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level))
           && (0 < cf->cft->log_level)))) {
    pcVar3 = winner->name;
    cVar11 = Curl_now();
    uVar5 = (winner->started).tv_sec;
    uVar6 = (winner->started).tv_usec;
    older.tv_usec = uVar6;
    older.tv_sec = uVar5;
    newer._12_4_ = 0;
    newer.tv_sec = SUB128(cVar11._0_12_,0);
    newer.tv_usec = SUB124(cVar11._0_12_,8);
    older._12_4_ = 0;
    uVar10 = Curl_timediff(newer,older);
    Curl_trc_cf_infof(data,cf,"connect+handshake %s: %dms, 1st data: %dms",pcVar3,
                      uVar10 & 0xffffffff,(ulong)uVar9);
  }
  pCVar4 = winner->cf;
  cf->next = pCVar4;
  winner->cf = (Curl_cfilter *)0x0;
  *puVar1 = 2;
  cf->field_0x24 = cf->field_0x24 | 1;
  return (CURLcode)pCVar4;
}

Assistant:

static CURLcode baller_connected(struct Curl_cfilter *cf,
                                 struct Curl_easy *data,
                                 struct cf_hc_baller *winner)
{
  struct cf_hc_ctx *ctx = cf->ctx;
  CURLcode result = CURLE_OK;
  int reply_ms;

  DEBUGASSERT(winner->cf);
  if(winner != &ctx->h3_baller)
    cf_hc_baller_reset(&ctx->h3_baller, data);
  if(winner != &ctx->h21_baller)
    cf_hc_baller_reset(&ctx->h21_baller, data);

  reply_ms = cf_hc_baller_reply_ms(winner, data);
  if(reply_ms >= 0)
    CURL_TRC_CF(data, cf, "connect+handshake %s: %dms, 1st data: %dms",
                winner->name, (int)Curl_timediff(Curl_now(), winner->started),
                reply_ms);
  else
    CURL_TRC_CF(data, cf, "deferred handshake %s: %dms",
                winner->name, (int)Curl_timediff(Curl_now(), winner->started));

  cf->next = winner->cf;
  winner->cf = NULL;

  switch(cf->conn->alpn) {
  case CURL_HTTP_VERSION_3:
    break;
  case CURL_HTTP_VERSION_2:
#ifdef USE_NGHTTP2
    /* Using nghttp2, we add the filter "below" us, so when the conn
     * closes, we tear it down for a fresh reconnect */
    result = Curl_http2_switch_at(cf, data);
    if(result) {
      ctx->state = CF_HC_FAILURE;
      ctx->result = result;
      return result;
    }
#endif
    break;
  default:
    break;
  }
  ctx->state = CF_HC_SUCCESS;
  cf->connected = TRUE;
  return result;
}